

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O0

CURLcode getinfo_slist(Curl_easy *data,CURLINFO info,curl_slist **param_slistp)

{
  connectdata *pcVar1;
  curl_sslbackend cVar2;
  curl_slist *pcVar3;
  curl_tlssessioninfo *pcVar4;
  void *pvVar5;
  uint local_4c;
  uint i;
  connectdata *conn;
  curl_tlssessioninfo *tsi;
  curl_tlssessioninfo **tsip;
  anon_union_8_2_12a2f876 ptr;
  curl_slist **param_slistp_local;
  CURLINFO info_local;
  Curl_easy *data_local;
  
  switch(info) {
  case CURLINFO_SSL_ENGINES:
    pcVar3 = Curl_ssl_engines_list(data);
    *param_slistp = pcVar3;
    break;
  case CURLINFO_COOKIELIST:
    pcVar3 = Curl_cookie_list(data);
    *param_slistp = pcVar3;
    break;
  default:
    return CURLE_UNKNOWN_OPTION;
  case CURLINFO_CERTINFO:
    *param_slistp = (curl_slist *)&(data->info).certs;
    break;
  case CURLINFO_TLS_SESSION:
  case CURLINFO_TLS_SSL_PTR:
    pcVar4 = &data->tsi;
    pcVar1 = data->easy_conn;
    *param_slistp = (curl_slist *)pcVar4;
    cVar2 = Curl_ssl_backend();
    pcVar4->backend = cVar2;
    (data->tsi).internals = (void *)0x0;
    if ((pcVar1 != (connectdata *)0x0) && (pcVar4->backend != CURLSSLBACKEND_NONE)) {
      for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
        if ((pcVar1->ssl[local_4c].use & 1U) != 0) {
          pvVar5 = (*Curl_ssl->get_internals)(pcVar1->ssl + local_4c,info);
          (data->tsi).internals = pvVar5;
          return CURLE_OK;
        }
      }
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode getinfo_slist(struct Curl_easy *data, CURLINFO info,
                              struct curl_slist **param_slistp)
{
  union {
    struct curl_certinfo *to_certinfo;
    struct curl_slist    *to_slist;
  } ptr;

  switch(info) {
  case CURLINFO_SSL_ENGINES:
    *param_slistp = Curl_ssl_engines_list(data);
    break;
  case CURLINFO_COOKIELIST:
    *param_slistp = Curl_cookie_list(data);
    break;
  case CURLINFO_CERTINFO:
    /* Return the a pointer to the certinfo struct. Not really an slist
       pointer but we can pretend it is here */
    ptr.to_certinfo = &data->info.certs;
    *param_slistp = ptr.to_slist;
    break;
  case CURLINFO_TLS_SESSION:
  case CURLINFO_TLS_SSL_PTR:
    {
      struct curl_tlssessioninfo **tsip = (struct curl_tlssessioninfo **)
                                          param_slistp;
      struct curl_tlssessioninfo *tsi = &data->tsi;
#ifdef USE_SSL
      struct connectdata *conn = data->easy_conn;
#endif

      *tsip = tsi;
      tsi->backend = Curl_ssl_backend();
      tsi->internals = NULL;

#ifdef USE_SSL
      if(conn && tsi->backend != CURLSSLBACKEND_NONE) {
        unsigned int i;
        for(i = 0; i < (sizeof(conn->ssl) / sizeof(conn->ssl[0])); ++i) {
          if(conn->ssl[i].use) {
            tsi->internals = Curl_ssl->get_internals(&conn->ssl[i], info);
            break;
          }
        }
      }
#endif
    }
    break;
  default:
    return CURLE_UNKNOWN_OPTION;
  }

  return CURLE_OK;
}